

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall IRBuilder::BuildConstantLoads(IRBuilder *this)

{
  Func *func;
  code *pcVar1;
  RegOpnd *dstOpnd_00;
  bool bVar2;
  anon_union_2_4_ea848c7b_for_ValueType_13 type_00;
  RegSlot RVar3;
  TypeId typeId;
  BOOL BVar4;
  JITTimeFunctionBody *pJVar5;
  intptr_t varConst_00;
  undefined4 *puVar6;
  JITRecyclableObject *var;
  JITJavascriptString *varLocal;
  RecyclableObject *local_98;
  JITJavascriptString *constStr;
  JITRecyclableObject *jitObj;
  Instr *local_40;
  Instr *instr;
  RegOpnd *pRStack_30;
  ValueType valueType;
  RegOpnd *dstOpnd;
  TypeId type;
  intptr_t varConst;
  RegSlot reg;
  RegSlot count;
  IRBuilder *this_local;
  
  pJVar5 = Func::GetJITFunctionBody(this->m_func);
  RVar3 = JITTimeFunctionBody::GetConstCount(pJVar5);
  varConst._0_4_ = 1;
  do {
    if (RVar3 <= (RegSlot)varConst) {
      return;
    }
    pJVar5 = Func::GetJITFunctionBody(this->m_func);
    varConst_00 = JITTimeFunctionBody::GetConstantVar(pJVar5,(RegSlot)varConst);
    if (varConst_00 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x589,"(varConst != 0)","varConst != 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pJVar5 = Func::GetJITFunctionBody(this->m_func);
    typeId = JITTimeFunctionBody::GetConstantType(pJVar5,(RegSlot)varConst);
    pRStack_30 = BuildDstOpnd(this,(RegSlot)varConst,TyVar,false,false);
    BVar4 = RegIsConstant(this,(RegSlot)varConst);
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x58d,"(this->RegIsConstant(reg))","this->RegIsConstant(reg)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    StackSym::SetIsFromByteCodeConstantTable(pRStack_30->m_sym);
    ValueType::ValueType((ValueType *)((long)&instr + 6));
    if (typeId == TypeIds_Number) {
      instr._6_2_ = ValueType::Number.field_0;
      local_40 = IR::Instr::NewConstantLoad
                           (pRStack_30,varConst_00,ValueType::Number,this->m_func,(Var)0x0);
    }
    else if (typeId == TypeIds_String) {
      instr._6_2_ = ValueType::String.field_0;
      bVar2 = Func::IsOOPJIT(this->m_func);
      if (bVar2) {
        pJVar5 = Func::GetJITFunctionBody(this->m_func);
        var = JITTimeFunctionBody::GetConstantContent(pJVar5,(RegSlot)varConst);
        varLocal = JITJavascriptString::FromVar(var);
        local_40 = IR::Instr::NewConstantLoad
                             (pRStack_30,varConst_00,(ValueType)instr._6_2_,this->m_func,varLocal);
      }
      else {
        local_40 = IR::Instr::NewConstantLoad
                             (pRStack_30,varConst_00,(ValueType)instr._6_2_,this->m_func,(Var)0x0);
      }
    }
    else if (typeId == TypeIds_Limit) {
      instr._6_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                    ValueType::FromTypeId(TypeIds_Limit,false);
      local_40 = IR::Instr::NewConstantLoad
                           (pRStack_30,varConst_00,(ValueType)instr._6_2_,this->m_func,(Var)0x0);
    }
    else {
      type_00.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::FromTypeId(typeId,false);
      dstOpnd_00 = pRStack_30;
      func = this->m_func;
      instr._6_2_ = type_00.field_0;
      bVar2 = Func::IsOOPJIT(this->m_func);
      if (bVar2) {
        pJVar5 = Func::GetJITFunctionBody(this->m_func);
        local_98 = JITTimeFunctionBody::GetConstAsT<Js::RecyclableObject>(pJVar5,(RegSlot)varConst);
      }
      else {
        local_98 = (RecyclableObject *)0x0;
      }
      local_40 = IR::Instr::NewConstantLoad
                           (dstOpnd_00,varConst_00,(ValueType)type_00.field_0,func,local_98);
    }
    AddInstr(this,local_40,0xffffffff);
    varConst._0_4_ = (RegSlot)varConst + 1;
  } while( true );
}

Assistant:

void
IRBuilder::BuildConstantLoads()
{
    Js::RegSlot count = m_func->GetJITFunctionBody()->GetConstCount();

    for (Js::RegSlot reg = Js::FunctionBody::FirstRegSlot; reg < count; reg++)
    {
        intptr_t varConst = m_func->GetJITFunctionBody()->GetConstantVar(reg);
        Assert(varConst != 0);
        Js::TypeId type = m_func->GetJITFunctionBody()->GetConstantType(reg);

        IR::RegOpnd *dstOpnd = this->BuildDstOpnd(reg);
        Assert(this->RegIsConstant(reg));
        dstOpnd->m_sym->SetIsFromByteCodeConstantTable();
        // TODO: be more precise about this
        ValueType valueType;
        IR::Instr *instr = nullptr;
        switch (type)
        {
        case Js::TypeIds_Number:
            valueType = ValueType::Number;
            instr = IR::Instr::NewConstantLoad(dstOpnd, varConst, valueType, m_func
#if !FLOATVAR
                , m_func->IsOOPJIT() ? m_func->GetJITFunctionBody()->GetConstAsT<Js::JavascriptNumber>(reg) : nullptr
#endif
            );
            break;
        case Js::TypeIds_String:
        {
            valueType = ValueType::String;
            if (m_func->IsOOPJIT())
            {
                // must be either PropertyString or LiteralString
                JITRecyclableObject * jitObj = m_func->GetJITFunctionBody()->GetConstantContent(reg);
                JITJavascriptString * constStr = JITJavascriptString::FromVar(jitObj);
                instr = IR::Instr::NewConstantLoad(dstOpnd, varConst, valueType, m_func, constStr);
            }
            else
            {
                instr = IR::Instr::NewConstantLoad(dstOpnd, varConst, valueType, m_func);
            }
            break;
        }
        case Js::TypeIds_Limit:
            valueType = ValueType::FromTypeId(type, false);
            instr = IR::Instr::NewConstantLoad(dstOpnd, varConst, valueType, m_func);
            break;
        default:
            valueType = ValueType::FromTypeId(type, false);
            instr = IR::Instr::NewConstantLoad(dstOpnd, varConst, valueType, m_func,
                m_func->IsOOPJIT() ? m_func->GetJITFunctionBody()->GetConstAsT<Js::RecyclableObject>(reg) : nullptr);
            break;
        }        
        this->AddInstr(instr, Js::Constants::NoByteCodeOffset);
    }

}